

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O0

TextureLevel * __thiscall
vkt::image::anon_unknown_0::MemoryQualifierInstanceBase::generateReferenceImage
          (TextureLevel *__return_storage_ptr__,MemoryQualifierInstanceBase *this)

{
  image *this_00;
  void **this_01;
  Vector<unsigned_int,_3> *this_02;
  deInt32 dVar1;
  deInt32 dVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int *piVar8;
  Vector<int,_4> local_118;
  undefined1 local_108 [24];
  deInt32 i;
  deInt32 sum;
  deInt32 groupBaseZ;
  deInt32 groupBaseY;
  deInt32 groupBaseX;
  deInt32 x_1;
  deInt32 y_1;
  deInt32 z_1;
  UVec3 localWorkGroupSize;
  uint local_bc;
  uint local_b8;
  deInt32 x;
  deInt32 y;
  deInt32 z;
  PixelBufferAccess referenceAccess;
  undefined1 local_78 [8];
  PixelBufferAccess baseAccess;
  TextureLevel base;
  UVec3 computeGridSize;
  MemoryQualifierInstanceBase *this_local;
  TextureLevel *reference;
  
  this_00 = (image *)((long)&base.m_data.m_cap + 4);
  getShaderGridSize(this_00,this->m_imageType,&this->m_imageSize);
  uVar3 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)this_00);
  uVar4 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)this_00);
  uVar5 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)this_00);
  this_01 = &baseAccess.super_ConstPixelBufferAccess.m_data;
  tcu::TextureLevel::TextureLevel((TextureLevel *)this_01,&this->m_format,uVar3,uVar4,uVar5);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_78,(TextureLevel *)this_01);
  referenceAccess.super_ConstPixelBufferAccess.m_data._3_1_ = 0;
  this_02 = (Vector<unsigned_int,_3> *)((long)&base.m_data.m_cap + 4);
  uVar3 = tcu::Vector<unsigned_int,_3>::x(this_02);
  uVar4 = tcu::Vector<unsigned_int,_3>::y(this_02);
  uVar5 = tcu::Vector<unsigned_int,_3>::z(this_02);
  tcu::TextureLevel::TextureLevel(__return_storage_ptr__,&this->m_format,uVar3,uVar4,uVar5);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&y,__return_storage_ptr__);
  for (x = 0; iVar6 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)local_78),
      x < iVar6; x = x + 1) {
    for (local_b8 = 0;
        iVar6 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)local_78),
        (int)local_b8 < iVar6; local_b8 = local_b8 + 1) {
      for (local_bc = 0;
          iVar6 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_78),
          (int)local_bc < iVar6; local_bc = local_bc + 1) {
        tcu::Vector<int,_4>::Vector
                  ((Vector<int,_4> *)(localWorkGroupSize.m_data + 1),local_bc ^ local_b8 ^ x);
        tcu::PixelBufferAccess::setPixel
                  ((PixelBufferAccess *)local_78,(IVec4 *)(localWorkGroupSize.m_data + 1),local_bc,
                   local_b8,x);
      }
    }
  }
  getLocalWorkGroupSize((anon_unknown_0 *)&y_1,this->m_imageType,&this->m_imageSize);
  for (x_1 = 0; dVar2 = x_1,
      iVar6 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)&y), dVar2 < iVar6;
      x_1 = x_1 + 1) {
    for (groupBaseX = 0; dVar2 = groupBaseX,
        iVar6 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&y), dVar2 < iVar6;
        groupBaseX = groupBaseX + 1) {
      for (groupBaseY = 0; dVar2 = groupBaseY,
          iVar6 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&y),
          dVar1 = groupBaseY, dVar2 < iVar6; groupBaseY = groupBaseY + 1) {
        uVar3 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)&y_1);
        uVar4 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)&y_1);
        dVar2 = groupBaseX;
        groupBaseZ = ((uint)dVar1 / uVar3) * uVar4;
        uVar3 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)&y_1);
        uVar4 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)&y_1);
        dVar1 = x_1;
        sum = ((uint)dVar2 / uVar3) * uVar4;
        uVar3 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)&y_1);
        uVar4 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)&y_1);
        i = ((uint)dVar1 / uVar3) * uVar4;
        local_108._20_4_ = 0;
        for (local_108._16_4_ = 0; dVar2 = groupBaseZ, (int)local_108._16_4_ < 4;
            local_108._16_4_ = local_108._16_4_ + 1) {
          uVar3 = groupBaseY +
                  *(int *)(image::(anonymous_namespace)::g_ShaderReadOffsetsX +
                          (long)(int)local_108._16_4_ * 4);
          uVar4 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)&y_1);
          dVar1 = sum;
          uVar5 = groupBaseX +
                  *(int *)(image::(anonymous_namespace)::g_ShaderReadOffsetsY +
                          (long)(int)local_108._16_4_ * 4);
          uVar7 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)&y_1);
          tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)&y_1);
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_108,(int)local_78,dVar2 + uVar3 % uVar4,
                     dVar1 + uVar5 % uVar7);
          piVar8 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_108);
          local_108._20_4_ = *piVar8 + local_108._20_4_;
        }
        tcu::Vector<int,_4>::Vector(&local_118,local_108._20_4_);
        tcu::PixelBufferAccess::setPixel
                  ((PixelBufferAccess *)&y,&local_118,groupBaseY,groupBaseX,x_1);
      }
    }
  }
  referenceAccess.super_ConstPixelBufferAccess.m_data._3_1_ = 1;
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&baseAccess.super_ConstPixelBufferAccess.m_data);
  return __return_storage_ptr__;
}

Assistant:

tcu::TextureLevel MemoryQualifierInstanceBase::generateReferenceImage (void) const
{
	// Generate a reference image data using the storage format
	const tcu::UVec3 computeGridSize = getShaderGridSize(m_imageType, m_imageSize);

	tcu::TextureLevel base(m_format, computeGridSize.x(), computeGridSize.y(), computeGridSize.z());
	tcu::PixelBufferAccess baseAccess = base.getAccess();

	tcu::TextureLevel reference(m_format, computeGridSize.x(), computeGridSize.y(), computeGridSize.z());
	tcu::PixelBufferAccess referenceAccess = reference.getAccess();

	for (deInt32 z = 0; z < baseAccess.getDepth(); ++z)
		for (deInt32 y = 0; y < baseAccess.getHeight(); ++y)
			for (deInt32 x = 0; x < baseAccess.getWidth(); ++x)
			{
				baseAccess.setPixel(tcu::IVec4(x^y^z), x, y, z);
			}

	const tcu::UVec3 localWorkGroupSize = getLocalWorkGroupSize(m_imageType, m_imageSize);

	for (deInt32 z = 0; z < referenceAccess.getDepth(); ++z)
		for (deInt32 y = 0; y < referenceAccess.getHeight(); ++y)
			for (deInt32 x = 0; x < referenceAccess.getWidth(); ++x)
			{
				const deInt32	groupBaseX	= x / localWorkGroupSize.x() * localWorkGroupSize.x();
				const deInt32	groupBaseY	= y / localWorkGroupSize.y() * localWorkGroupSize.y();
				const deInt32	groupBaseZ	= z / localWorkGroupSize.z() * localWorkGroupSize.z();
				deInt32			sum			= 0;

				for (deInt32 i = 0; i < DE_LENGTH_OF_ARRAY(g_ShaderReadOffsetsX); i++)
				{
					sum += baseAccess.getPixelInt(
						groupBaseX + (x + g_ShaderReadOffsetsX[i]) % localWorkGroupSize.x(),
						groupBaseY + (y + g_ShaderReadOffsetsY[i]) % localWorkGroupSize.y(),
						groupBaseZ + (z + g_ShaderReadOffsetsZ[i]) % localWorkGroupSize.z()).x();
				}

				referenceAccess.setPixel(tcu::IVec4(sum), x, y, z);
			}

	return reference;
}